

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O0

void __thiscall chaiscript::detail::Dispatch_Engine::~Dispatch_Engine(Dispatch_Engine *this)

{
  State *in_RDI;
  
  State::~State(in_RDI);
  threading::Thread_Storage<chaiscript::detail::Stack_Holder>::~Thread_Storage
            ((Thread_Storage<chaiscript::detail::Stack_Holder> *)in_RDI);
  Type_Conversions::~Type_Conversions((Type_Conversions *)in_RDI);
  return;
}

Assistant:

~Dispatch_Engine()
        {
        }